

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O1

void __thiscall intel_acbp_v2_t::acbp_element_t::_read(acbp_element_t *this)

{
  intel_acbp_v2_t *piVar1;
  header_t *phVar2;
  ibbs_body_t *piVar3;
  pmda_body_t *ppVar4;
  header_t *this_00;
  ibbs_body_t *this_01;
  pmda_body_t *this_02;
  string local_40;
  
  this_00 = (header_t *)operator_new(0x30);
  piVar1 = this->m__root;
  (this_00->super_kstruct).m__io = (this->super_kstruct).m__io;
  (this_00->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__header_t_001aa690;
  this_00->m__parent = this;
  this_00->m__root = piVar1;
  header_t::_read(this_00);
  phVar2 = (this->m_header)._M_t.
           super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
           .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl;
  (this->m_header)._M_t.
  super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>.
  _M_t.
  super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
  .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl = this_00;
  if (phVar2 != (header_t *)0x0) {
    (**(code **)((long)(phVar2->super_kstruct)._vptr_kstruct + 8))();
  }
  this->n_ibbs_body = true;
  phVar2 = (this->m_header)._M_t.
           super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
           .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl;
  if ((phVar2->m_structure_id == STRUCTURE_IDS_IBBS) && (0xb < phVar2->m_total_size)) {
    this->n_ibbs_body = false;
    this_01 = (ibbs_body_t *)operator_new(0x88);
    ibbs_body_t::ibbs_body_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    piVar3 = (this->m_ibbs_body)._M_t.
             super___uniq_ptr_impl<intel_acbp_v2_t::ibbs_body_t,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_intel_acbp_v2_t::ibbs_body_t_*,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
             .super__Head_base<0UL,_intel_acbp_v2_t::ibbs_body_t_*,_false>._M_head_impl;
    (this->m_ibbs_body)._M_t.
    super___uniq_ptr_impl<intel_acbp_v2_t::ibbs_body_t,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_intel_acbp_v2_t::ibbs_body_t_*,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
    .super__Head_base<0UL,_intel_acbp_v2_t::ibbs_body_t_*,_false>._M_head_impl = this_01;
    if (piVar3 != (ibbs_body_t *)0x0) {
      (**(code **)((long)(piVar3->super_kstruct)._vptr_kstruct + 8))();
    }
  }
  this->n_pmda_body = true;
  phVar2 = (this->m_header)._M_t.
           super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
           .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl;
  if ((phVar2->m_structure_id == STRUCTURE_IDS_PMDA) && (0xb < phVar2->m_total_size)) {
    this->n_pmda_body = false;
    this_02 = (pmda_body_t *)operator_new(0x38);
    pmda_body_t::pmda_body_t(this_02,(this->super_kstruct).m__io,this,this->m__root);
    ppVar4 = (this->m_pmda_body)._M_t.
             super___uniq_ptr_impl<intel_acbp_v2_t::pmda_body_t,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_intel_acbp_v2_t::pmda_body_t_*,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
             .super__Head_base<0UL,_intel_acbp_v2_t::pmda_body_t_*,_false>._M_head_impl;
    (this->m_pmda_body)._M_t.
    super___uniq_ptr_impl<intel_acbp_v2_t::pmda_body_t,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_intel_acbp_v2_t::pmda_body_t_*,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
    .super__Head_base<0UL,_intel_acbp_v2_t::pmda_body_t_*,_false>._M_head_impl = this_02;
    if (ppVar4 != (pmda_body_t *)0x0) {
      (**(code **)((long)(ppVar4->super_kstruct)._vptr_kstruct + 8))();
    }
  }
  this->n_generic_body = true;
  phVar2 = (this->m_header)._M_t.
           super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
           .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl;
  if (((phVar2->m_structure_id != STRUCTURE_IDS_PMDA) &&
      (phVar2->m_structure_id != STRUCTURE_IDS_IBBS)) && (0xb < phVar2->m_total_size)) {
    this->n_generic_body = false;
    kaitai::kstream::read_bytes_abi_cxx11_
              (&local_40,(this->super_kstruct).m__io,(ulong)phVar2->m_total_size - 0xc);
    std::__cxx11::string::operator=((string *)&this->m_generic_body,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void intel_acbp_v2_t::acbp_element_t::_read() {
    m_header = std::unique_ptr<header_t>(new header_t(m__io, this, m__root));
    n_ibbs_body = true;
    if ( ((header()->structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_IBBS) && (header()->total_size() >= 12)) ) {
        n_ibbs_body = false;
        m_ibbs_body = std::unique_ptr<ibbs_body_t>(new ibbs_body_t(m__io, this, m__root));
    }
    n_pmda_body = true;
    if ( ((header()->structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_PMDA) && (header()->total_size() >= 12)) ) {
        n_pmda_body = false;
        m_pmda_body = std::unique_ptr<pmda_body_t>(new pmda_body_t(m__io, this, m__root));
    }
    n_generic_body = true;
    if ( ((header()->structure_id() != intel_acbp_v2_t::STRUCTURE_IDS_IBBS) && (header()->structure_id() != intel_acbp_v2_t::STRUCTURE_IDS_PMDA) && (header()->total_size() >= 12)) ) {
        n_generic_body = false;
        m_generic_body = m__io->read_bytes((header()->total_size() - 12));
    }
}